

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert-expr.c
# Opt level: O2

uint ptrlen_to_port_number(ptrlen input)

{
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  
  pcVar3 = (char *)input.ptr;
  pcVar2 = pcVar3 + input.len;
  uVar1 = 0;
  while( true ) {
    if (pcVar2 <= pcVar3) {
      return uVar1;
    }
    if (9 < (byte)(*pcVar3 - 0x30U)) break;
    uVar1 = (uint)(byte)(*pcVar3 - 0x30U) + uVar1 * 10;
    if (0xffff < uVar1) {
      uVar1 = 0x10000;
    }
    pcVar3 = pcVar3 + 1;
  }
  __assert_fail("\'0\' <= *p && *p <= \'9\'",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/cert-expr.c"
                ,0x152,"unsigned int ptrlen_to_port_number(ptrlen)");
}

Assistant:

static unsigned ptrlen_to_port_number(ptrlen input)
{
    unsigned val = 0;
    for (const char *p = input.ptr, *end = p + input.len; p < end; p++) {
        assert('0' <= *p && *p <= '9'); /* expect parser to have checked */
        val = 10 * val + (*p - '0');
        if (val >= 65536)
            val = 65536; /* normalise 'too large' to avoid integer overflow */
    }
    return val;
}